

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O0

mraa_result_t i2c_get(int bus,uint8_t device_address,uint8_t register_address,uint8_t *data)

{
  int iVar1;
  long lVar2;
  mraa_i2c_context i2c;
  mraa_result_t status;
  uint8_t *data_local;
  uint8_t register_address_local;
  mraa_result_t mStack_c;
  uint8_t device_address_local;
  int bus_local;
  
  lVar2 = mraa_i2c_init(bus);
  if (lVar2 == 0) {
    mStack_c = MRAA_ERROR_NO_RESOURCES;
  }
  else {
    i2c._4_4_ = mraa_i2c_address(lVar2,device_address);
    if ((i2c._4_4_ == MRAA_SUCCESS) &&
       (i2c._4_4_ = mraa_i2c_write_byte(lVar2,register_address), i2c._4_4_ == MRAA_SUCCESS)) {
      iVar1 = mraa_i2c_read(lVar2,data,1);
      i2c._4_4_ = MRAA_ERROR_UNSPECIFIED;
      if (iVar1 == 1) {
        i2c._4_4_ = MRAA_SUCCESS;
      }
    }
    mraa_i2c_stop(lVar2);
    mStack_c = i2c._4_4_;
  }
  return mStack_c;
}

Assistant:

mraa_result_t
i2c_get(int bus, uint8_t device_address, uint8_t register_address, uint8_t* data)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_i2c_context i2c = mraa_i2c_init(bus);
    if (i2c == NULL) {
        return MRAA_ERROR_NO_RESOURCES;
    }
    status = mraa_i2c_address(i2c, device_address);
    if (status != MRAA_SUCCESS) {
        goto i2c_get_exit;
    }
    status = mraa_i2c_write_byte(i2c, register_address);
    if (status != MRAA_SUCCESS) {
        goto i2c_get_exit;
    }
    status = mraa_i2c_read(i2c, data, 1) == 1 ? MRAA_SUCCESS : MRAA_ERROR_UNSPECIFIED;
    if (status != MRAA_SUCCESS) {
        goto i2c_get_exit;
    }
i2c_get_exit:
    mraa_i2c_stop(i2c);
    return status;
}